

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

bool __thiscall
TPZMatrix<int>::SolveEigensystemJacobi
          (TPZMatrix<int> *this,int64_t *numiterations,REAL *tol,TPZVec<int> *Eigenvalues,
          TPZFMatrix<int> *Eigenvectors)

{
  double dVar1;
  long lVar2;
  ulong row;
  bool bVar3;
  double dVar4;
  bool bVar5;
  int iVar6;
  ulong uVar7;
  int *piVar8;
  int64_t i;
  int64_t i_7;
  int64_t j;
  ulong uVar9;
  TPZFNMatrix<3,_int> VecIni;
  TPZFNMatrix<9,_int> Matrix;
  TPZFNMatrix<3,_int> VecIni_cp;
  double local_3e8;
  long local_388;
  TPZFNMatrix<3,_int> local_380;
  _func_int **local_2e0;
  _func_int **local_2d8;
  TPZFMatrix<int> local_2d0;
  int local_240 [10];
  TPZFMatrix<int> local_218;
  int local_188 [10];
  TPZFNMatrix<3,_int> local_160;
  TPZFMatrix<int> local_c0;
  
  lVar2 = *numiterations;
  dVar1 = *tol;
  row = (this->super_TPZBaseMatrix).fRow;
  local_218.fElem = local_188;
  local_218.super_TPZMatrix<int>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_218.super_TPZMatrix<int>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_2d8 = (_func_int **)&PTR__TPZFMatrix_0186fee8;
  local_218.super_TPZMatrix<int>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0186fee8;
  local_218.fSize = 9;
  local_218.super_TPZMatrix<int>.super_TPZBaseMatrix.fRow = row;
  local_218.super_TPZMatrix<int>.super_TPZBaseMatrix.fCol = row;
  local_218.fGiven = local_218.fElem;
  TPZVec<int>::TPZVec(&local_218.fPivot.super_TPZVec<int>,0);
  local_218.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_218.fPivot.super_TPZVec<int>.fStore = local_218.fPivot.fExtAlloc;
  local_218.fPivot.super_TPZVec<int>.fNElements = 0;
  local_218.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_218.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
  local_218.fWork.fStore = (int *)0x0;
  local_218.fWork.fNElements = 0;
  local_218.fWork.fNAlloc = 0;
  piVar8 = (int *)0x0;
  if ((row != 0) && (uVar7 = row * row, piVar8 = local_218.fElem, 9 < uVar7)) {
    uVar9 = 0xffffffffffffffff;
    if (uVar7 >> 0x3e == 0) {
      uVar9 = uVar7 * 4;
    }
    piVar8 = (int *)operator_new__(uVar9);
  }
  local_218.fElem = piVar8;
  local_2e0 = (_func_int **)&PTR__TPZFNMatrix_0186fbf8;
  local_218.super_TPZMatrix<int>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_0186fbf8;
  if (0 < (long)row) {
    uVar7 = 0;
    do {
      uVar9 = 0;
      do {
        iVar6 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])
                          (this,uVar7,uVar9);
        if ((local_218.super_TPZMatrix<int>.super_TPZBaseMatrix.fRow <= (long)uVar7) ||
           (local_218.super_TPZMatrix<int>.super_TPZBaseMatrix.fCol <= (long)uVar9)) {
          TPZFMatrix<int>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        local_218.fElem[local_218.super_TPZMatrix<int>.super_TPZBaseMatrix.fRow * uVar9 + uVar7] =
             iVar6;
        uVar9 = uVar9 + 1;
      } while (row != uVar9);
      uVar7 = uVar7 + 1;
    } while (uVar7 != row);
  }
  bVar5 = SolveEigenvaluesJacobi(&local_218.super_TPZMatrix<int>,numiterations,tol,Eigenvalues);
  if (bVar5) {
    local_2d0.super_TPZMatrix<int>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         local_2d0.super_TPZMatrix<int>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable &
         0xffffffff00000000;
    TPZFNMatrix<3,_int>::TPZFNMatrix(&local_380,row,1,(int *)&local_2d0);
    local_2d0.super_TPZMatrix<int>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         local_2d0.super_TPZMatrix<int>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable &
         0xffffffff00000000;
    TPZFNMatrix<3,_int>::TPZFNMatrix(&local_160,row,1,(int *)&local_2d0);
    (*(Eigenvectors->super_TPZMatrix<int>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
      [0xd])(Eigenvectors,row,row);
    (*(Eigenvectors->super_TPZMatrix<int>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
      [0xf])(Eigenvectors);
    if (0 < (long)row) {
      uVar7 = 0;
      do {
        uVar9 = 0;
        do {
          iVar6 = rand();
          local_380.super_TPZFMatrix<int>.fElem[uVar9] = iVar6;
          uVar9 = uVar9 + 1;
        } while (row != uVar9);
        TPZFMatrix<int>::TPZFMatrix(&local_c0,this);
        local_2d0.super_TPZMatrix<int>.super_TPZBaseMatrix.fRow = 0;
        local_2d0.super_TPZMatrix<int>.super_TPZBaseMatrix.fCol = 0;
        local_2d0.super_TPZMatrix<int>.super_TPZBaseMatrix.fDecomposed = '\0';
        local_2d0.super_TPZMatrix<int>.super_TPZBaseMatrix.fDefPositive = '\0';
        local_2d0.super_TPZMatrix<int>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
             local_2d8;
        local_2d0.fSize = 9;
        local_2d0.fElem = local_240;
        local_2d0.fGiven = local_240;
        TPZVec<int>::TPZVec(&local_2d0.fPivot.super_TPZVec<int>,0);
        local_2d0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
        local_2d0.fPivot.super_TPZVec<int>.fStore = local_2d0.fPivot.fExtAlloc;
        local_2d0.fPivot.super_TPZVec<int>.fNElements = 0;
        local_2d0.fPivot.super_TPZVec<int>.fNAlloc = 0;
        local_2d0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
        local_2d0.fWork.fNAlloc = 0;
        local_2d0.fWork.fStore = (int *)0x0;
        local_2d0.fWork.fNElements = 0;
        local_2d0.fElem = (int *)0x0;
        local_2d0.super_TPZMatrix<int>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
             local_2e0;
        TPZFMatrix<int>::operator=(&local_2d0,&local_c0);
        TPZFMatrix<int>::~TPZFMatrix(&local_c0);
        iVar6 = ReturnNearestValue(Eigenvalues->fStore[uVar7],Eigenvalues,0);
        dVar4 = ABS((double)(iVar6 - Eigenvalues->fStore[uVar7]));
        if (dVar4 <= 1e-05) {
          uVar9 = 0;
          do {
            iVar6 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                              (this,uVar9,uVar9);
            local_2d0.fElem
            [(uVar9 & 0xffffffff) * local_2d0.super_TPZMatrix<int>.super_TPZBaseMatrix.fRow + uVar9]
                 = iVar6 - Eigenvalues->fStore[uVar7];
            uVar9 = uVar9 + 1;
          } while (row != uVar9);
        }
        else {
          uVar9 = 0;
          do {
            iVar6 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                              (this,uVar9,uVar9);
            local_2d0.fElem
            [(uVar9 & 0xffffffff) * local_2d0.super_TPZMatrix<int>.super_TPZBaseMatrix.fRow + uVar9]
                 = (iVar6 + (int)(dVar4 * 0.01)) - Eigenvalues->fStore[uVar7];
            uVar9 = uVar9 + 1;
          } while (row != uVar9);
        }
        local_3e8 = 0.0;
        uVar9 = 0;
        do {
          if ((local_380.super_TPZFMatrix<int>.super_TPZMatrix<int>.super_TPZBaseMatrix.fRow <=
               (long)uVar9) ||
             (local_380.super_TPZFMatrix<int>.super_TPZMatrix<int>.super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<int>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if ((local_380.super_TPZFMatrix<int>.super_TPZMatrix<int>.super_TPZBaseMatrix.fRow <=
               (long)uVar9) ||
             (local_380.super_TPZFMatrix<int>.super_TPZMatrix<int>.super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<int>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          local_3e8 = local_3e8 +
                      ABS((double)local_380.super_TPZFMatrix<int>.fElem[uVar9]) *
                      ABS((double)local_380.super_TPZFMatrix<int>.fElem[uVar9]);
          uVar9 = uVar9 + 1;
        } while (row != uVar9);
        if (local_3e8 < 0.0) {
          local_3e8 = sqrt(local_3e8);
        }
        else {
          local_3e8 = SQRT(local_3e8);
        }
        uVar9 = 0;
        do {
          if ((local_380.super_TPZFMatrix<int>.super_TPZMatrix<int>.super_TPZBaseMatrix.fRow <=
               (long)uVar9) ||
             (local_380.super_TPZFMatrix<int>.super_TPZMatrix<int>.super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<int>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if ((local_380.super_TPZFMatrix<int>.super_TPZMatrix<int>.super_TPZBaseMatrix.fRow <=
               (long)uVar9) ||
             (local_380.super_TPZFMatrix<int>.super_TPZMatrix<int>.super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<int>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          local_380.super_TPZFMatrix<int>.fElem[uVar9] =
               local_380.super_TPZFMatrix<int>.fElem[uVar9] / (int)local_3e8;
          uVar9 = uVar9 + 1;
        } while (row != uVar9);
        if (-1 < lVar2 && dVar1 < 10.0) {
          local_388 = 0;
          do {
            uVar9 = 0;
            do {
              if ((local_380.super_TPZFMatrix<int>.super_TPZMatrix<int>.super_TPZBaseMatrix.fRow <=
                   (long)uVar9) ||
                 (local_380.super_TPZFMatrix<int>.super_TPZMatrix<int>.super_TPZBaseMatrix.fCol < 1)
                 ) {
                TPZFMatrix<int>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if ((local_160.super_TPZFMatrix<int>.super_TPZMatrix<int>.super_TPZBaseMatrix.fRow <=
                   (long)uVar9) ||
                 (local_160.super_TPZFMatrix<int>.super_TPZMatrix<int>.super_TPZBaseMatrix.fCol < 1)
                 ) {
                TPZFMatrix<int>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              local_160.super_TPZFMatrix<int>.fElem[uVar9] =
                   local_380.super_TPZFMatrix<int>.fElem[uVar9];
              uVar9 = uVar9 + 1;
            } while (row != uVar9);
            iVar6 = (*local_2d0.super_TPZMatrix<int>.super_TPZBaseMatrix.super_TPZSavable.
                      _vptr_TPZSavable[0x10])(&local_2d0);
            if (iVar6 != 0) {
              Error("LU decomposition is not a symmetric decomposition",(char *)0x0);
            }
            iVar6 = (*local_2d0.super_TPZMatrix<int>.super_TPZBaseMatrix.super_TPZSavable.
                      _vptr_TPZSavable[0x17])(&local_2d0);
            if (iVar6 != 0) {
              (*local_2d0.super_TPZMatrix<int>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
                [0x43])(&local_2d0);
            }
            local_3e8 = 0.0;
            uVar9 = 0;
            do {
              if ((local_380.super_TPZFMatrix<int>.super_TPZMatrix<int>.super_TPZBaseMatrix.fRow <=
                   (long)uVar9) ||
                 (local_380.super_TPZFMatrix<int>.super_TPZMatrix<int>.super_TPZBaseMatrix.fCol < 1)
                 ) {
                TPZFMatrix<int>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if ((local_380.super_TPZFMatrix<int>.super_TPZMatrix<int>.super_TPZBaseMatrix.fRow <=
                   (long)uVar9) ||
                 (local_380.super_TPZFMatrix<int>.super_TPZMatrix<int>.super_TPZBaseMatrix.fCol < 1)
                 ) {
                TPZFMatrix<int>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              local_3e8 = local_3e8 +
                          ABS((double)local_380.super_TPZFMatrix<int>.fElem[uVar9]) *
                          ABS((double)local_380.super_TPZFMatrix<int>.fElem[uVar9]);
              uVar9 = uVar9 + 1;
            } while (row != uVar9);
            if (local_3e8 < 0.0) {
              dVar4 = sqrt(local_3e8);
            }
            else {
              dVar4 = SQRT(local_3e8);
            }
            local_3e8 = 0.0;
            uVar9 = 0;
            do {
              if ((local_380.super_TPZFMatrix<int>.super_TPZMatrix<int>.super_TPZBaseMatrix.fRow <=
                   (long)uVar9) ||
                 (local_380.super_TPZFMatrix<int>.super_TPZMatrix<int>.super_TPZBaseMatrix.fCol < 1)
                 ) {
                TPZFMatrix<int>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if ((local_380.super_TPZFMatrix<int>.super_TPZMatrix<int>.super_TPZBaseMatrix.fRow <=
                   (long)uVar9) ||
                 (local_380.super_TPZFMatrix<int>.super_TPZMatrix<int>.super_TPZBaseMatrix.fCol < 1)
                 ) {
                TPZFMatrix<int>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              local_380.super_TPZFMatrix<int>.fElem[uVar9] =
                   local_380.super_TPZFMatrix<int>.fElem[uVar9] / (int)dVar4;
              if ((local_160.super_TPZFMatrix<int>.super_TPZMatrix<int>.super_TPZBaseMatrix.fRow <=
                   (long)uVar9) ||
                 (local_160.super_TPZFMatrix<int>.super_TPZMatrix<int>.super_TPZBaseMatrix.fCol < 1)
                 ) {
                TPZFMatrix<int>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if ((local_380.super_TPZFMatrix<int>.super_TPZMatrix<int>.super_TPZBaseMatrix.fRow <=
                   (long)uVar9) ||
                 (local_380.super_TPZFMatrix<int>.super_TPZMatrix<int>.super_TPZBaseMatrix.fCol < 1)
                 ) {
                TPZFMatrix<int>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if ((local_160.super_TPZFMatrix<int>.super_TPZMatrix<int>.super_TPZBaseMatrix.fRow <=
                   (long)uVar9) ||
                 (local_160.super_TPZFMatrix<int>.super_TPZMatrix<int>.super_TPZBaseMatrix.fCol < 1)
                 ) {
                TPZFMatrix<int>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if ((local_380.super_TPZFMatrix<int>.super_TPZMatrix<int>.super_TPZBaseMatrix.fRow <=
                   (long)uVar9) ||
                 (local_380.super_TPZFMatrix<int>.super_TPZMatrix<int>.super_TPZBaseMatrix.fCol < 1)
                 ) {
                TPZFMatrix<int>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              local_3e8 = local_3e8 +
                          ABS((double)((local_160.super_TPZFMatrix<int>.fElem[uVar9] -
                                       local_380.super_TPZFMatrix<int>.fElem[uVar9]) *
                                      (local_160.super_TPZFMatrix<int>.fElem[uVar9] -
                                      local_380.super_TPZFMatrix<int>.fElem[uVar9])));
              uVar9 = uVar9 + 1;
            } while (row != uVar9);
            if (local_3e8 < 0.0) {
              local_3e8 = sqrt(local_3e8);
            }
            else {
              local_3e8 = SQRT(local_3e8);
            }
          } while ((dVar1 < local_3e8) &&
                  (bVar3 = local_388 < lVar2, local_388 = local_388 + 1, bVar3));
        }
        uVar9 = 0;
        do {
          if ((local_380.super_TPZFMatrix<int>.super_TPZMatrix<int>.super_TPZBaseMatrix.fRow <=
               (long)uVar9) ||
             (local_380.super_TPZFMatrix<int>.super_TPZMatrix<int>.super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<int>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          iVar6 = 0;
          if (1e-05 <= ABS((double)local_380.super_TPZFMatrix<int>.fElem[uVar9])) {
            iVar6 = local_380.super_TPZFMatrix<int>.fElem[uVar9];
          }
          if (((Eigenvectors->super_TPZMatrix<int>).super_TPZBaseMatrix.fRow <= (long)uVar7) ||
             ((Eigenvectors->super_TPZMatrix<int>).super_TPZBaseMatrix.fCol <= (long)uVar9)) {
            TPZFMatrix<int>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          Eigenvectors->fElem
          [(Eigenvectors->super_TPZMatrix<int>).super_TPZBaseMatrix.fRow * uVar9 + uVar7] = iVar6;
          uVar9 = uVar9 + 1;
        } while (row != uVar9);
        TPZFMatrix<int>::~TPZFMatrix(&local_2d0,&PTR_PTR_0186feb0);
        uVar7 = uVar7 + 1;
      } while (uVar7 != row);
    }
    TPZFMatrix<int>::~TPZFMatrix(&local_160.super_TPZFMatrix<int>,&PTR_PTR_01870870);
    TPZFMatrix<int>::~TPZFMatrix(&local_380.super_TPZFMatrix<int>,&PTR_PTR_01870870);
  }
  TPZFMatrix<int>::~TPZFMatrix(&local_218,&PTR_PTR_0186feb0);
  return bVar5;
}

Assistant:

bool TPZMatrix<TVar>::SolveEigensystemJacobi(int64_t &numiterations, REAL & tol, TPZVec<TVar> & Eigenvalues, TPZFMatrix<TVar> & Eigenvectors) const{
	
	int64_t NumIt = numiterations;
	REAL tolerance = tol;
	
#ifdef PZDEBUG2
	if (this->Rows() != this->Cols())
	{
		PZError << __PRETTY_FUNCTION__ <<
		" - Jacobi method of computing eigensystem requires a symmetric square matrix. this->Rows = " << this->Rows() << " - this->Cols() = " << this->Cols() << endl;
		return false;
	}
	
	if (this->VerifySymmetry(1.e-8) == false)
	{
		PZError << __PRETTY_FUNCTION__ <<
		" - Jacobi method of computing eigensystem requires a symmetric square matrix. This matrix is not symmetric." << endl;
		return false;
	}
#endif
	
	const int64_t size = this->Rows();
	
	/** Making a copy of this */
	TPZFNMatrix<9,TVar> Matrix(size,size); //fast constructor in case of this is a stress or strain tensor.
	for(int64_t i = 0; i < size; i++) for(int64_t j = 0; j < size; j++) Matrix(i,j) = this->Get(i,j);
	
	/** Compute Eigenvalues *//////////////////////////////////////
	bool result = Matrix.SolveEigenvaluesJacobi(numiterations, tol, &Eigenvalues);
	if (result == false) return false;
	
	/** Compute Eigenvectors *//////////////////////////////////////
	TPZFNMatrix<3, TVar> VecIni(size,1,0.), VecIni_cp(size,1,0.);
	
	Eigenvectors.Resize(size, size);
	Eigenvectors.Zero();
	for(int64_t eigen = 0; eigen < size; eigen++)
	{
        for(int64_t i = 0; i < size; i++) VecIni.PutVal(i,0,rand());
		
        TPZFNMatrix<9,TVar> Matrix(*this);
		
        TVar answ = ReturnNearestValue(Eigenvalues[eigen], Eigenvalues,((TVar)1.E-5));
        TVar exp = answ - Eigenvalues[eigen];
        if((REAL)(fabs(exp)) > 1.E-5)
        {
            for(int64_t i = 0; i < size; i++) Matrix.PutVal(i,i, this->GetVal(i,i) - (TVar)(Eigenvalues[eigen] - (TVar)(0.01 * fabs(exp))) );
        }
        else
        {
            for(int64_t i = 0; i < size; i++) Matrix.PutVal(i,i, this->GetVal(i,i) - (Eigenvalues[eigen] - TVar(0.01)) );
        }
		
        /** Normalizing Initial Eigenvec */
        REAL norm1 = 0.;
        for(int64_t i = 0; i < size; i++) norm1 += fabs(VecIni(i,0)) * fabs(VecIni(i,0)); norm1 = sqrt(norm1);
        for(int64_t i = 0; i < size; i++) VecIni(i,0) = VecIni(i,0)/(TVar)norm1;
		
        int64_t count = 0;
        double dif = 10., difTemp = 0.;
		
        while(dif > tolerance && count <= NumIt)
        {
			for(int64_t i = 0; i < size; i++) VecIni_cp(i,0) = VecIni(i,0);
			
			/** Estimating Eigenvec */
			Matrix.Solve_LU(&VecIni);
			
			/** Normalizing Final Eigenvec */
			REAL norm2 = 0.;
			for(int64_t i = 0; i < size; i++) norm2 += fabs(VecIni(i,0)) * fabs(VecIni(i,0));
			norm2 = sqrt(norm2);
			
			difTemp = 0.;
			for(int64_t i = 0; i < size; i++)
			{
                VecIni(i,0) = VecIni(i,0)/(TVar)norm2;
                TVar exp = (VecIni_cp(i,0) - VecIni(i,0)) * (VecIni_cp(i,0) - VecIni(i,0));
                difTemp += fabs(exp);
			}
			dif = sqrt(difTemp);
			count++;
        }
		
        /** Copy values from AuxVector to Eigenvectors */
        for(int64_t i = 0; i < size; i++)
        {
			TVar val = VecIni(i,0);
			if((REAL)(fabs(val)) < 1.E-5) val = 0.;
			Eigenvectors(eigen,i) = val;
        }
		
#ifdef PZDEBUG2
        double norm = 0.;
        for(int64_t i = 0; i < size; i++) norm += fabs(VecIni(i,0)) * fabs(VecIni(i,0));
        if (fabs(norm - 1.) > 1.e-10)
        {
            PZError << __PRETTY_FUNCTION__ << endl;
        }
        if(count > NumIt-1)// O metodo nao convergiu !!!
        {
            PZError << __PRETTY_FUNCTION__ << endl;
#ifdef PZ_LOG
            {
                std::stringstream sout;
                Print("Matrix for SolveEigensystemJacobi did not converge",sout);
                LOGPZ_DEBUG(logger,sout.str());
            }
#endif
        }
#endif
	}
	
	return true;
	
}